

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::exception_detail::clone_base_const>::
shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>>
          (shared_ptr<const_boost::exception_detail::clone_base> *this,
          clone_impl<boost::exception_detail::bad_exception_> *p)

{
  shared_ptr<const_boost::exception_detail::clone_base> *in_RSI;
  clone_impl<boost::exception_detail::bad_exception_> *in_RDI;
  refcount_ptr<boost::exception_detail::error_info_container> *this_00;
  _func_int **local_28;
  
  local_28 = (_func_int **)0x0;
  if (in_RSI != (shared_ptr<const_boost::exception_detail::clone_base> *)0x0) {
    local_28 = (_func_int **)((long)&in_RSI->px + (long)in_RSI->px[-3]._vptr_clone_base);
  }
  (in_RDI->super_bad_exception_).super_exception._vptr_exception = local_28;
  this_00 = &(in_RDI->super_bad_exception_).super_exception.data_;
  detail::shared_count::shared_count((shared_count *)this_00);
  detail::
  sp_pointer_construct<boost::exception_detail::clone_base_const,boost::exception_detail::clone_impl<boost::exception_detail::bad_exception_>>
            (in_RSI,in_RDI,(shared_count *)this_00);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }